

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O3

Formula * Kernel::Formula::createLet(uint functor,VList *variables,TermList body,Formula *contents)

{
  TermList body_00;
  TermList bodySort;
  Term *pTVar1;
  Formula *pFVar2;
  void **head;
  
  body_00._content = (uint64_t)Term::createFormula(contents);
  bodySort = AtomicSort::boolSort();
  pTVar1 = Term::createLet(functor,variables,body,body_00,bodySort);
  pFVar2 = (Formula *)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  pFVar2->_connective = BOOL_TERM;
  (pFVar2->_label)._M_dataplus._M_p = (pointer)&(pFVar2->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pFVar2->_label,DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + DEFAULT_LABEL_abi_cxx11_);
  *(Term **)(pFVar2 + 1) = pTVar1;
  return pFVar2;
}

Assistant:

Formula* Formula::createLet(unsigned functor, VList* variables, TermList body, Formula* contents)
{
  TermList contentsTerm(Term::createFormula(contents));
  TermList letTerm(Term::createLet(functor, variables, body, contentsTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(letTerm);
}